

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O1

SyncInfo __thiscall
vkt::synchronization::anon_unknown_0::ClearAttachments::Implementation::getSyncInfo
          (Implementation *this)

{
  uint uVar1;
  VkImageLayout in_EDX;
  SyncInfo SVar2;
  SyncInfo SVar3;
  
  uVar1 = (this->m_resource->m_imageData).subresourceRange.aspectMask - 1;
  if (uVar1 < 4) {
    SVar2.imageLayout = *(VkImageLayout *)(&DAT_00b50d70 + (ulong)uVar1 * 4);
    SVar2._0_8_ = *(undefined8 *)(&DAT_00b52570 + (ulong)uVar1 * 8);
    return SVar2;
  }
  SVar3.imageLayout = in_EDX;
  SVar3.stageMask = 0x10000;
  SVar3.accessMask = 0;
  return SVar3;
}

Assistant:

SyncInfo getSyncInfo (void) const
	{
		SyncInfo syncInfo;
		syncInfo.stageMask = VK_PIPELINE_STAGE_ALL_COMMANDS_BIT;

		switch (m_resource.getImage().subresourceRange.aspectMask)
		{
			case VK_IMAGE_ASPECT_COLOR_BIT:
				syncInfo.accessMask		= VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT;
				syncInfo.imageLayout	= VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
			break;
			case VK_IMAGE_ASPECT_STENCIL_BIT:
			case VK_IMAGE_ASPECT_DEPTH_BIT:
				syncInfo.accessMask		= VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT;
				syncInfo.imageLayout	= VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
			break;
			default:
				DE_ASSERT(0);
			break;
		}

		return syncInfo;
	}